

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O3

Vec_Int_t * Abc_ManReadBinary(char *pFileName,char *pToken)

{
  char cVar1;
  char *__haystack;
  Vec_Str_t *__ptr;
  char *pcVar2;
  size_t sVar3;
  Vec_Int_t *p;
  int *piVar4;
  long lVar5;
  int Entry;
  bool bVar6;
  
  __ptr = Abc_ManReadFile(pFileName);
  if (__ptr == (Vec_Str_t *)0x0) {
    p = (Vec_Int_t *)0x0;
  }
  else {
    __haystack = __ptr->pArray;
    pcVar2 = strstr(__haystack,pToken);
    if (pcVar2 == (char *)0x0) {
      p = (Vec_Int_t *)0x0;
    }
    else {
      sVar3 = strlen(pToken);
      pcVar2 = pcVar2 + sVar3;
      p = (Vec_Int_t *)malloc(0x10);
      p->nCap = 100;
      p->nSize = 0;
      piVar4 = (int *)malloc(400);
      p->pArray = piVar4;
      sVar3 = strlen(pcVar2);
      if (0 < (int)(uint)sVar3) {
        lVar5 = 0;
        do {
          cVar1 = pcVar2[lVar5];
          Entry = 0;
          if ((cVar1 == '0') || (cVar1 == '?')) {
LAB_002bddc4:
            Vec_IntPush(p,Entry);
          }
          else if (cVar1 == '1') {
            Entry = 1;
            goto LAB_002bddc4;
          }
        } while ((0x19 < (byte)((pcVar2[lVar5] & 0xdfU) + 0xbf)) &&
                (bVar6 = (ulong)((uint)sVar3 & 0x7fffffff) - 1 != lVar5, lVar5 = lVar5 + 1, bVar6));
      }
    }
    if (__haystack != (char *)0x0) {
      free(__haystack);
    }
    free(__ptr);
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_ManReadBinary( char * pFileName, char * pToken )
{
    Vec_Int_t * vMap = NULL;
    Vec_Str_t * vStr;
    char * pStr;
    int i, Length;
    vStr = Abc_ManReadFile( pFileName );
    if ( vStr == NULL )
        return NULL;
    pStr = Vec_StrArray( vStr );
    pStr = strstr( pStr, pToken );
    if ( pStr != NULL )
    {
        pStr  += strlen( pToken );
        vMap   = Vec_IntAlloc( 100 );
        Length = strlen( pStr );
        for ( i = 0; i < Length; i++ )
        {
            if ( pStr[i] == '0' || pStr[i] == '?' )
                Vec_IntPush( vMap, 0 );
            else if ( pStr[i] == '1' )
                Vec_IntPush( vMap, 1 );
            if ( ('a' <= pStr[i] && pStr[i] <= 'z') || 
                 ('A' <= pStr[i] && pStr[i] <= 'Z') )
                break;
        }
    }
    Vec_StrFree( vStr );
    return vMap;
}